

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# araplanner.cpp
# Opt level: O0

int __thiscall
ARAPlanner::SetSearchGoalState
          (ARAPlanner *this,int SearchGoalStateID,ARASearchStateSpace_t *pSearchStateSpace)

{
  undefined8 uVar1;
  long in_RDX;
  int in_ESI;
  long *in_RDI;
  
  if ((*(long *)(in_RDX + 0x28) == 0) || (**(int **)(in_RDX + 0x28) != in_ESI)) {
    uVar1 = (**(code **)(*in_RDI + 0xd0))(in_RDI,in_ESI,in_RDX);
    *(undefined8 *)(in_RDX + 0x28) = uVar1;
    *(undefined8 *)(in_RDX + 8) = 0x41cdcd6500000000;
    *(undefined1 *)(in_RDX + 0x52) = 1;
    *(long *)in_RDI[0x10] = in_RDI[2];
    *(undefined1 *)(in_RDX + 0x50) = 1;
  }
  return 1;
}

Assistant:

int ARAPlanner::SetSearchGoalState(int SearchGoalStateID, ARASearchStateSpace_t* pSearchStateSpace)
{
    if (pSearchStateSpace->searchgoalstate == NULL ||
        pSearchStateSpace->searchgoalstate->StateID != SearchGoalStateID)
    {
        pSearchStateSpace->searchgoalstate = GetState(SearchGoalStateID, pSearchStateSpace);

        //should be new search iteration
        pSearchStateSpace->eps_satisfied = INFINITECOST;
        pSearchStateSpace->bNewSearchIteration = true;
        pSearchStateSpace_->eps = this->finitial_eps;

#if USE_HEUR
        //recompute heuristic for the heap if heuristics is used
        pSearchStateSpace->bReevaluatefvals = true;
#endif
    }

    return 1;
}